

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_sub2_i32_m68k
               (TCGContext_conflict2 *tcg_ctx,TCGv_i32 rl,TCGv_i32 rh,TCGv_i32 al,TCGv_i32 ah,
               TCGv_i32 bl,TCGv_i32 bh)

{
  uc_struct_conflict3 *uc_00;
  _Bool _Var1;
  TCGv_i64 dest;
  TCGv_i64 dest_00;
  bool bVar2;
  TCGv_i64 t1;
  TCGv_i64 t0;
  list_item *cur;
  hook *hook;
  uc_struct *uc;
  TCGv_i32 bl_local;
  TCGv_i32 ah_local;
  TCGv_i32 al_local;
  TCGv_i32 rh_local;
  TCGv_i32 rl_local;
  TCGContext_conflict2 *tcg_ctx_local;
  
  uc_00 = tcg_ctx->uc;
  _Var1 = _hook_exists_bounded(uc_00->hook[0x10].head,tcg_ctx->pc_start);
  if (_Var1) {
    t0 = (TCGv_i64)uc_00->hook[0x10].head;
    while( true ) {
      bVar2 = false;
      if (t0 != (TCGv_i64)0x0) {
        cur = *(list_item **)(t0 + 8);
        bVar2 = cur != (list_item *)0x0;
      }
      if (!bVar2) break;
      if (((((ulong)cur[1].next & 0x100000000) == 0) && (*(int *)((long)&cur->data + 4) == 0)) &&
         (*(int *)&cur[1].next == 0)) {
        dest = tcg_temp_new_i64(tcg_ctx);
        dest_00 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_concat_i32_i64_m68k(tcg_ctx,dest,al,ah);
        tcg_gen_concat_i32_i64_m68k(tcg_ctx,dest_00,bl,bh);
        gen_uc_traceopcode(tcg_ctx,cur,dest,dest_00,0x20,uc_00,tcg_ctx->pc_start);
        tcg_temp_free_i64(tcg_ctx,dest);
        tcg_temp_free_i64(tcg_ctx,dest_00);
      }
      t0 = *(TCGv_i64 *)t0;
    }
  }
  tcg_gen_op6_i32(tcg_ctx,INDEX_op_sub2_i32,rl,rh,al,ah,bl,bh);
  return;
}

Assistant:

void tcg_gen_sub2_i32(TCGContext *tcg_ctx, TCGv_i32 rl, TCGv_i32 rh, TCGv_i32 al,
                      TCGv_i32 ah, TCGv_i32 bl, TCGv_i32 bh)
{
    uc_engine *uc = tcg_ctx->uc;

    if (TCG_TARGET_HAS_sub2_i32) {
        if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_TCG_OPCODE, tcg_ctx->pc_start)) {
            struct hook *hook;
            HOOK_FOREACH_VAR_DECLARE;
            HOOK_FOREACH(uc, hook, UC_HOOK_TCG_OPCODE) {
                if (hook->to_delete)
                    continue;
                if (hook->op == UC_TCG_OP_SUB && hook->op_flags == 0) {
                    // Calling tcg_gen_sub_i64 will cause infinite recursion.
                    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
                    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
                    tcg_gen_concat_i32_i64(tcg_ctx, t0, al, ah);
                    tcg_gen_concat_i32_i64(tcg_ctx, t1, bl, bh);
                    gen_uc_traceopcode(tcg_ctx, hook, t0, t1, 32, uc, tcg_ctx->pc_start);
                    tcg_temp_free_i64(tcg_ctx, t0);
                    tcg_temp_free_i64(tcg_ctx, t1);
                }
            }
        }
        tcg_gen_op6_i32(tcg_ctx, INDEX_op_sub2_i32, rl, rh, al, ah, bl, bh);
    } else {
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_concat_i32_i64(tcg_ctx, t0, al, ah);
        tcg_gen_concat_i32_i64(tcg_ctx, t1, bl, bh);
        tcg_gen_sub_i64(tcg_ctx, t0, t0, t1);
        tcg_gen_extr_i64_i32(tcg_ctx, rl, rh, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
        tcg_temp_free_i64(tcg_ctx, t1);
    }
}